

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

void __thiscall
kj::_::HeapDisposer<kj::_::XThreadFulfiller<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>_>
::disposeImpl(HeapDisposer<kj::_::XThreadFulfiller<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>_>
              *this,void *pointer)

{
  Exception local_1a0;
  
  if (pointer != (void *)0x0) {
    if (*(long *)((long)pointer + 8) != 0) {
      XThreadPaf::unfulfilledException();
      XThreadFulfiller<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>::reject
                ((XThreadFulfiller<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *)pointer,
                 &local_1a0);
      Exception::~Exception(&local_1a0);
    }
    AsyncObject::~AsyncObject((AsyncObject *)pointer);
    operator_delete(pointer,0x10);
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }